

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O1

DynamicType * __thiscall Js::ES5Array::DuplicateType(ES5Array *this)

{
  Recycler *alloc;
  DynamicType *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&ES5ArrayType::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_63b7f62;
  data.filename._0_4_ = 0x12;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((((((this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
                          super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                     (TrackAllocData *)local_40);
  this_00 = (DynamicType *)new<Memory::Recycler>(0x38,alloc,0x38bbb2);
  ES5ArrayType::ES5ArrayType
            ((ES5ArrayType *)this_00,
             (DynamicType *)
             (this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
             super_RecyclableObject.type.ptr);
  return this_00;
}

Assistant:

DynamicType* ES5Array::DuplicateType()
    {
        return RecyclerNew(GetScriptContext()->GetRecycler(), ES5ArrayType, this->GetDynamicType());
    }